

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

UnblindParameter *
cfd::core::ConfidentialTransaction::CalculateUnblindData
          (UnblindParameter *__return_storage_ptr__,ConfidentialNonce *nonce,Privkey *blinding_key,
          ByteData *rangeproof,ConfidentialValue *value_commitment,Script *extra,
          ConfidentialAssetId *asset)

{
  UnblindParameter *this;
  CfdException *this_00;
  Amount AVar1;
  ConfidentialAssetId local_180;
  undefined1 local_158 [28];
  int ret;
  UnblindParameter *local_138;
  uint64_t value_out;
  pointer local_128;
  size_t local_120;
  pointer local_118;
  pointer local_110;
  vector<unsigned_char,_std::allocator<unsigned_char>_> asset_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> vbf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> abf_out;
  vector<unsigned_char,_std::allocator<unsigned_char>_> entropy_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> extra_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> commitment_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> rangeproof_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> blinding_key_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> nonce_bytes;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180,
             &(nonce->data_).data_);
  ByteData::GetBytes(&nonce_bytes,(ByteData *)&local_180);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  Privkey::GetData((ByteData *)&local_180,blinding_key);
  ByteData::GetBytes(&blinding_key_bytes,(ByteData *)&local_180);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  ByteData::GetBytes(&rangeproof_bytes,rangeproof);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180,
             &(value_commitment->data_).data_);
  ByteData::GetBytes(&commitment_bytes,(ByteData *)&local_180);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  Script::GetData((ByteData *)&local_180,extra);
  ByteData::GetBytes(&extra_bytes,(ByteData *)&local_180);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  ConfidentialAssetId::GetData((ByteData *)&local_180,asset);
  ByteData::GetBytes(&entropy_bytes,(ByteData *)&local_180);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&abf_out,0x20,(allocator_type *)&local_180);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&vbf_out,0x20,(allocator_type *)&local_180);
  local_138 = __return_storage_ptr__;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&asset_out,0x20,(allocator_type *)&local_180);
  value_out = 0;
  local_110 = commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_120 = (long)commitment_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)commitment_bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  local_118 = extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_128 = entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start;
  ret = wally_asset_unblind(nonce_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)nonce_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)nonce_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            blinding_key_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)blinding_key_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)blinding_key_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            rangeproof_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)rangeproof_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)rangeproof_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            commitment_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,local_120,
                            extra_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)extra_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)extra_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            entropy_bytes.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)entropy_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)entropy_bytes.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            asset_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)asset_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)asset_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            abf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)abf_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)abf_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                            vbf_out.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)vbf_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)vbf_out.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start,&value_out);
  this = local_138;
  if (ret == 0) {
    UnblindParameter::UnblindParameter(local_138);
    ByteData::ByteData((ByteData *)local_158,&asset_out);
    ConfidentialAssetId::ConfidentialAssetId(&local_180,(ByteData *)local_158);
    ConfidentialAssetId::operator=(&this->asset,&local_180);
    ConfidentialAssetId::~ConfidentialAssetId(&local_180);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    ByteData256::ByteData256((ByteData256 *)local_158,&abf_out);
    BlindFactor::BlindFactor((BlindFactor *)&local_180,(ByteData256 *)local_158);
    BlindFactor::operator=(&this->abf,(BlindFactor *)&local_180);
    BlindFactor::~BlindFactor((BlindFactor *)&local_180);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    ByteData256::ByteData256((ByteData256 *)local_158,&vbf_out);
    BlindFactor::BlindFactor((BlindFactor *)&local_180,(ByteData256 *)local_158);
    BlindFactor::operator=(&this->vbf,(BlindFactor *)&local_180);
    BlindFactor::~BlindFactor((BlindFactor *)&local_180);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_158);
    AVar1 = Amount::CreateBySatoshiAmount(value_out);
    local_158._0_8_ = AVar1.amount_;
    local_158[8] = AVar1.ignore_check_;
    ConfidentialValue::ConfidentialValue((ConfidentialValue *)&local_180,(Amount *)local_158);
    ConfidentialValue::operator=(&this->value,(ConfidentialValue *)&local_180);
    ConfidentialValue::~ConfidentialValue((ConfidentialValue *)&local_180);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&asset_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&vbf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&abf_out.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&entropy_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&extra_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&commitment_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&rangeproof_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&blinding_key_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
              );
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&nonce_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return this;
  }
  local_180._vptr_ConfidentialAssetId = (_func_int **)0x4b5451;
  local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xb99;
  local_180.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = "CalculateUnblindData";
  logger::warn<int&>((CfdSourceLocation *)&local_180,"wally_asset_unblind NG[{}].",&ret);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_180,"unblind confidential data error.",(allocator *)local_158);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_180);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

UnblindParameter ConfidentialTransaction::CalculateUnblindData(
    const ConfidentialNonce &nonce, const Privkey &blinding_key,
    const ByteData &rangeproof, const ConfidentialValue &value_commitment,
    const Script &extra, const ConfidentialAssetId &asset) {
  const std::vector<uint8_t> nonce_bytes = nonce.GetData().GetBytes();
  const std::vector<uint8_t> blinding_key_bytes =
      blinding_key.GetData().GetBytes();
  const std::vector<uint8_t> rangeproof_bytes = rangeproof.GetBytes();
  const std::vector<uint8_t> commitment_bytes =
      value_commitment.GetData().GetBytes();
  const std::vector<uint8_t> extra_bytes = extra.GetData().GetBytes();
  const std::vector<uint8_t> entropy_bytes = asset.GetData().GetBytes();
  std::vector<uint8_t> abf_out(kBlindFactorSize);
  std::vector<uint8_t> vbf_out(kBlindFactorSize);
  std::vector<uint8_t> asset_out(kAssetSize);
  uint64_t value_out = 0;
  int ret = wally_asset_unblind(
      nonce_bytes.data(), nonce_bytes.size(), blinding_key_bytes.data(),
      blinding_key_bytes.size(), rangeproof_bytes.data(),
      rangeproof_bytes.size(), commitment_bytes.data(),
      commitment_bytes.size(), extra_bytes.data(), extra_bytes.size(),
      entropy_bytes.data(), entropy_bytes.size(), asset_out.data(),
      asset_out.size(), abf_out.data(), abf_out.size(), vbf_out.data(),
      vbf_out.size(), &value_out);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_asset_unblind NG[{}].", ret);
    throw CfdException(
        kCfdIllegalStateError, "unblind confidential data error.");
  }

  UnblindParameter result;
  result.asset = ConfidentialAssetId(asset_out);
  result.abf = BlindFactor(ByteData256(abf_out));
  result.vbf = BlindFactor(ByteData256(vbf_out));
  result.value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_out));

  return result;
}